

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_write(Curl_easy *data,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written)

{
  CURLcode CVar1;
  bool local_3d;
  int num;
  connectdata *conn;
  ssize_t *written_local;
  size_t len_local;
  void *mem_local;
  curl_socket_t sockfd_local;
  Curl_easy *data_local;
  
  local_3d = false;
  if (sockfd != -1) {
    local_3d = sockfd == data->conn->sock[1];
  }
  CVar1 = Curl_nwrite(data,(uint)local_3d,mem,len,written);
  return CVar1;
}

Assistant:

CURLcode Curl_write(struct Curl_easy *data,
                    curl_socket_t sockfd,
                    const void *mem,
                    size_t len,
                    ssize_t *written)
{
  struct connectdata *conn;
  int num;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
  num = (sockfd != CURL_SOCKET_BAD && sockfd == conn->sock[SECONDARYSOCKET]);
  return Curl_nwrite(data, num, mem, len, written);
}